

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.cpp
# Opt level: O3

void __thiscall
TPZIntelGen<pzshape::TPZShapeQuad>::Write
          (TPZIntelGen<pzshape::TPZShapeQuad> *this,TPZStream *buf,int withclassid)

{
  undefined4 uVar1;
  int classid;
  ulong local_58;
  TPZVec<int> local_50;
  int aiStack_30 [4];
  
  TPZInterpolatedElement::Write(&this->super_TPZInterpolatedElement,buf,withclassid);
  TPZVec<int>::TPZVec(&local_50,0);
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_50.fNElements = 3;
  local_50.fNAlloc = 0;
  aiStack_30[0] = 0;
  aiStack_30[1] = 0;
  aiStack_30[2] = 0;
  local_50.fStore = aiStack_30;
  TPZIntQuad::GetOrder(&this->fIntRule,&local_50);
  local_58 = local_50.fNElements;
  (*buf->_vptr_TPZStream[5])(buf,&local_58,1);
  if (local_58 != 0) {
    (*buf->_vptr_TPZStream[3])(buf,local_50.fStore,local_50.fNElements & 0xffffffff);
  }
  (*buf->_vptr_TPZStream[3])
            (buf,&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder,1
            );
  uVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(this);
  local_58 = CONCAT44(local_58._4_4_,uVar1);
  (*buf->_vptr_TPZStream[3])(buf,&local_58,1);
  if (local_50.fStore != aiStack_30) {
    local_50.fNAlloc = 0;
    local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_50.fStore != (int *)0x0) {
      operator_delete__(local_50.fStore);
    }
  }
  return;
}

Assistant:

void TPZIntelGen<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
	TPZManVector<int,3> order(3,0);
	fIntRule.GetOrder(order);
	buf.Write(order);
	buf.Write(&fPreferredOrder,1);
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}